

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

bool __thiscall HModel::workArrays_OK(HModel *this,int phase)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  pointer pdVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  ulong uVar11;
  char *pcVar12;
  int var;
  long lVar13;
  bool bVar14;
  double dVar15;
  
  bVar10 = true;
  if (phase != 1) {
    bVar14 = 0 < this->numCol;
    bVar10 = true;
    if (0 < this->numCol) {
      lVar13 = 0;
      do {
        dVar1 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar13];
        if (dVar1 <= -1e+200) {
LAB_0012b168:
          dVar1 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13];
          bVar6 = true;
          if (dVar1 < 1e+200) {
            dVar15 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13];
            bVar10 = (bool)(-(dVar1 == dVar15) & 1);
            if ((dVar1 != dVar15) || (NAN(dVar1) || NAN(dVar15))) {
              pcVar12 = "For col %d, workUpper should be %g but is %g\n";
              goto LAB_0012b1ab;
            }
          }
        }
        else {
          dVar15 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13];
          bVar10 = (bool)(-(dVar1 == dVar15) & 1);
          if ((dVar1 == dVar15) && (!NAN(dVar1) && !NAN(dVar15))) goto LAB_0012b168;
          pcVar12 = "For col %d, workLower should be %g but is %g\n";
LAB_0012b1ab:
          printf(pcVar12);
          bVar6 = false;
        }
        if (!bVar6) break;
        lVar13 = lVar13 + 1;
        bVar14 = lVar13 < this->numCol;
      } while (lVar13 < this->numCol);
    }
    if (bVar14) {
      return false;
    }
    bVar14 = 0 < this->numRow;
    if (0 < this->numRow) {
      lVar13 = 0;
      do {
        lVar9 = this->numCol + lVar13;
        dVar1 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9];
        if (dVar1 <= -1e+200) {
LAB_0012b26d:
          dVar1 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar9];
          bVar6 = true;
          if (dVar1 < 1e+200) {
            dVar15 = -(this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar13];
            bVar10 = (bool)(-(dVar1 == dVar15) & 1);
            if ((dVar1 != dVar15) || (NAN(dVar1) || NAN(dVar15))) {
              pcVar12 = "For row %d, workUpper should be %g but is %g\n";
              goto LAB_0012b2b3;
            }
          }
        }
        else {
          dVar15 = -(this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13];
          bVar10 = (bool)(-(dVar1 == dVar15) & 1);
          if ((dVar1 == dVar15) && (!NAN(dVar1) && !NAN(dVar15))) goto LAB_0012b26d;
          pcVar12 = "For row %d, workLower should be %g but is %g\n";
LAB_0012b2b3:
          printf(pcVar12);
          bVar6 = false;
        }
        if (!bVar6) break;
        lVar13 = lVar13 + 1;
        bVar14 = lVar13 < this->numRow;
      } while (lVar13 < this->numRow);
    }
    if (bVar14) {
      return false;
    }
  }
  uVar8 = (ulong)this->numTot;
  bVar14 = 0 < (long)uVar8;
  if (0 < (long)uVar8) {
    pdVar2 = (this->workRange).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = *pdVar2;
    dVar15 = *pdVar4 - *pdVar3;
    bVar10 = (bool)(-(dVar15 == dVar1) & 1);
    if ((dVar1 == dVar15) && (!NAN(dVar1) && !NAN(dVar15))) {
      uVar11 = 0;
      do {
        if (uVar8 - 1 == uVar11) {
          bVar14 = uVar11 + 1 < uVar8;
          goto LAB_0012b31d;
        }
        dVar1 = pdVar2[uVar11 + 1];
        dVar15 = pdVar4[uVar11 + 1] - pdVar3[uVar11 + 1];
        bVar10 = (bool)(-(dVar15 == dVar1) & 1);
        uVar11 = uVar11 + 1;
      } while ((dVar1 == dVar15) && (!NAN(dVar1) && !NAN(dVar15)));
      bVar14 = uVar11 < uVar8;
    }
    printf("For variable %d, workRange should be %g = %g - %g but is %g\n");
  }
LAB_0012b31d:
  if (!bVar14) {
    if (this->problemPerturbed != 0) {
      return bVar10;
    }
    uVar8 = (ulong)this->numCol;
    bVar14 = 0 < (long)uVar8;
    if (0 < (long)uVar8) {
      pdVar2 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar15 = *pdVar2 * (double)this->objSense;
      dVar1 = *pdVar3;
      bVar10 = (bool)(-(dVar15 == dVar1) & 1);
      if ((dVar1 != dVar15) || (NAN(dVar1) || NAN(dVar15))) {
        uVar11 = 0;
      }
      else {
        uVar7 = 1;
        do {
          uVar11 = uVar7;
          if (uVar8 == uVar11) {
            bVar14 = uVar11 < uVar8;
            goto LAB_0012b3fc;
          }
          dVar15 = pdVar2[uVar11] * (double)this->objSense;
          dVar1 = pdVar3[uVar11];
          bVar10 = (bool)(-(dVar15 == dVar1) & 1);
        } while ((dVar1 == dVar15) && (uVar7 = uVar11 + 1, !NAN(dVar1) && !NAN(dVar15)));
        bVar14 = uVar11 < uVar8;
      }
      printf("For col %d, workLower should be %g but is %g\n",
             (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11]);
    }
LAB_0012b3fc:
    if (!bVar14) {
      uVar8 = (ulong)this->numRow;
      bVar14 = 0 < (long)uVar8;
      if (0 < (long)uVar8) {
        pdVar5 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar1 = pdVar5[this->numCol];
        bVar10 = (bool)(-(dVar1 == 0.0) & 1);
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          uVar11 = 0;
        }
        else {
          uVar11 = 0;
          do {
            if (uVar8 - 1 == uVar11) {
              bVar14 = uVar11 + 1 < uVar8;
              goto LAB_0012b4a5;
            }
            dVar1 = pdVar5[(long)this->numCol + uVar11 + 1];
            bVar10 = (bool)(-(dVar1 == 0.0) & 1);
            uVar11 = uVar11 + 1;
          } while ((dVar1 == 0.0) && (!NAN(dVar1)));
          bVar14 = uVar11 < uVar8;
        }
        printf("For row %d, workCost should be zero but is %g\n",uVar11);
      }
LAB_0012b4a5:
      if (!bVar14) {
        return bVar10;
      }
    }
  }
  return false;
}

Assistant:

bool HModel::workArrays_OK(int phase) {
  //  printf("Called workArrays_OK(%d)\n", phase);cout << flush;
  bool ok = true;
  //Don't check phase 1 bounds: these will have been set by solve() so can be trusted
  if (phase != 1) {
    for (int col = 0; col < numCol; ++col) {
      int var = col;
      if (!hsol_isInfinity(-workLower[var])) {
	ok = workLower[var] == colLower[col];
	if (!ok) {
	  printf("For col %d, workLower should be %g but is %g\n", col, colLower[col], workLower[var]);
	  return ok;
	}
      }
      if (!hsol_isInfinity(workUpper[var])) {
	ok = workUpper[var] == colUpper[col];
	if (!ok) {
	  printf("For col %d, workUpper should be %g but is %g\n", col, colUpper[col], workUpper[var]);
	  return ok;
	}
      }
    }
    for (int row = 0; row < numRow; ++row) {
      int var = numCol + row;
      if (!hsol_isInfinity(-workLower[var])) {
	ok = workLower[var] == -rowUpper[row];
	if (!ok) {
	  printf("For row %d, workLower should be %g but is %g\n", row, -rowUpper[row], workLower[var]);
	  return ok;
	}
      }
      if (!hsol_isInfinity(workUpper[var])) {
	ok = workUpper[var] == -rowLower[row];
	if (!ok) {
	  printf("For row %d, workUpper should be %g but is %g\n", row, -rowLower[row], workUpper[var]);
	  return ok;
	}
      }
    }
  }
  for (int var = 0; var < numTot; ++var) {
    ok = workRange[var] == (workUpper[var] - workLower[var]);
    if (!ok) {
      printf("For variable %d, workRange should be %g = %g - %g but is %g\n",
	     var, workUpper[var] - workLower[var], workUpper[var], workLower[var], workRange[var]);
      return ok;
    }
  }
  //Don't check perturbed costs: these will have been set by solve() so can be trusted
  if (!problemPerturbed) {
    for (int col = 0; col < numCol; ++col) {
      int var = col;
      double sense_col_cost = objSense*colCost[col];
      ok = workCost[var] == sense_col_cost;
      if (!ok) {
	printf("For col %d, workLower should be %g but is %g\n", col, colLower[col], workCost[var]);
	return ok;
      }
    }
    for (int row = 0; row < numRow; ++row) {
      int var = numCol + row;
      ok = workCost[var] == 0.;
      if (!ok) {
	printf("For row %d, workCost should be zero but is %g\n", row, workCost[var]);
	return ok;
      }
    }
  }
  //ok must be true if we reach here
  assert(ok);
  return ok;
}